

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
     ::
     dynamic_push_3<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>>
               (lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                *i_queue)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  Derived2 move_source;
  Derived2 copy_source;
  runtime_type local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  double local_70;
  InstanceCounted local_68 [8];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  double local_40;
  InstanceCounted local_38 [8];
  
  local_98.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived2>
       ::s_table;
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::dyn_push(i_queue,&local_98);
  local_50._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_50 + 0xc));
  local_50._0_8_ = &PTR_class_id_010792f8;
  local_40 = 22.0;
  InstanceCounted::new_instance(local_38);
  local_60._0_8_ = Derived2::vtable + 0x18;
  local_50._0_8_ = Derived2::vtable + 0x50;
  local_60[8] = '\x16';
  InstanceCounted::new_instance((InstanceCounted *)(local_60 + 9));
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::dyn_push_copy(i_queue,&local_98,local_60);
  local_80._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_80 + 0xc));
  local_80._0_8_ = &PTR_class_id_010792f8;
  local_70 = 22.0;
  InstanceCounted::new_instance(local_68);
  local_90._0_8_ = Derived2::vtable + 0x18;
  local_80._0_8_ = Derived2::vtable + 0x50;
  local_90[8] = '\x16';
  InstanceCounted::new_instance((InstanceCounted *)(local_90 + 9));
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::dyn_push_move(i_queue,&local_98,local_90);
  Derived2::~Derived2((Derived2 *)local_90,&Derived2::VTT);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_80);
  Derived2::~Derived2((Derived2 *)local_60,&Derived2::VTT);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_50);
  return;
}

Assistant:

static void dynamic_push_3(QUEUE & i_queue)
        {
            auto const type = QUEUE::runtime_type::template make<ELEMENT>();

            i_queue.dyn_push(type);

            ELEMENT copy_source;
            i_queue.dyn_push_copy(type, &copy_source);

            ELEMENT move_source;
            i_queue.dyn_push_move(type, &move_source);
        }